

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget)

{
  TargetType TVar1;
  pointer pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  PolicyStatus PVar5;
  cmLinkImplementationLibraries *pcVar6;
  cmLinkImplementation *pcVar7;
  char *pcVar8;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  cmLinkItem *lib;
  cmLinkItem *__v;
  pointer __v_00;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar9;
  string propName;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  allocator<char> local_a9;
  string *local_a8;
  string local_a0;
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  local_80;
  string local_50;
  
  local_a8 = config;
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar5 = GetPolicyStatusCMP0022(this);
    if ((PVar5 == WARN) || (PVar5 = GetPolicyStatusCMP0022(this), PVar5 == OLD)) {
      pcVar6 = GetLinkImplementationLibrariesInternal(this,local_a8,headTarget);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar6->WrongConfigLibraries)
      ;
    }
  }
  else {
    TVar1 = this->Target->TargetTypeValue;
    if ((TVar1 < UNKNOWN_LIBRARY) && ((0x86U >> (TVar1 & 0x1f) & 1) != 0)) {
      local_80._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_80._M_impl.super__Rb_tree_header._M_header;
      local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar2 = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
               super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_80._M_impl.super__Rb_tree_header._M_header._M_right =
           local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      for (__v = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_start; __v != pcVar2; __v = __v + 1) {
        std::
        _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
        ::_M_insert_unique<cmLinkItem_const&>
                  ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                    *)&local_80,__v);
      }
      if (this->Target->TargetTypeValue != INTERFACE_LIBRARY) {
        pcVar7 = GetLinkImplementation(this,local_a8);
        pcVar3 = (pcVar7->super_cmLinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__v_00 = (pcVar7->super_cmLinkImplementationLibraries).Libraries.
                      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                      super__Vector_impl_data._M_start; __v_00 != pcVar3; __v_00 = __v_00 + 1) {
          pVar9 = std::
                  _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                  ::_M_insert_unique<cmLinkItem_const&>
                            ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                              *)&local_80,&__v_00->super_cmLinkItem);
          if (((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
              (pcVar4 = (__v_00->super_cmLinkItem).Target, pcVar4 != (cmGeneratorTarget *)0x0)) &&
             (pcVar4->Target->TargetTypeValue == SHARED_LIBRARY)) {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (&(iface->super_cmLinkInterface).SharedDeps,&__v_00->super_cmLinkItem);
          }
        }
      }
      std::
      _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
      ::~_Rb_tree(&local_80);
    }
  }
  if ((this->Target->TargetTypeValue == STATIC_LIBRARY) &&
     (pcVar7 = GetLinkImplementation(this,local_a8), pcVar7 != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,&pcVar7->Languages);
  }
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"_",(allocator<char> *)&local_a0);
  if (local_a8->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&local_80);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_a0,local_a8);
    std::__cxx11::string::append((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"LINK_INTERFACE_MULTIPLICITY",(allocator<char> *)&local_50);
  std::__cxx11::string::append((string *)&local_a0);
  pcVar8 = GetProperty(this,&local_a0);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"LINK_INTERFACE_MULTIPLICITY",&local_a9);
    pcVar8 = GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pcVar8 == (char *)0x0) goto LAB_0015dc1a;
  }
  __isoc99_sscanf(pcVar8,"%u",&(iface->super_cmLinkInterface).Multiplicity);
LAB_0015dc1a:
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget) const
{
  if (iface.ExplicitLibraries) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      std::set<cmLinkItem> emitted;
      for (cmLinkItem const& lib : iface.Libraries) {
        emitted.insert(lib);
      }
      if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        cmLinkImplementation const* impl = this->GetLinkImplementation(config);
        for (cmLinkImplItem const& lib : impl->Libraries) {
          if (emitted.insert(lib).second) {
            if (lib.Target) {
              // This is a runtime dependency on another shared library.
              if (lib.Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
                iface.SharedDeps.push_back(lib);
              }
            } else {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
            }
          }
        }
      }
    }
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD) {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
  }

  if (this->LinkLanguagePropagatesToDependents()) {
    // Targets using this archive need its language runtime libraries.
    if (cmLinkImplementation const* impl =
          this->GetLinkImplementation(config)) {
      iface.Languages = impl->Languages;
    }
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if (!config.empty()) {
      suffix += cmSystemTools::UpperCase(config);
    } else {
      suffix += "NOCONFIG";
    }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if (const char* config_reps = this->GetProperty(propName)) {
      sscanf(config_reps, "%u", &iface.Multiplicity);
    } else if (const char* reps =
                 this->GetProperty("LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps, "%u", &iface.Multiplicity);
    }
  }
}